

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,BlendShape *prim,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  tinyusdz *ptVar3;
  uint32_t indent_00;
  string *psVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  undefined3 in_register_00000081;
  uint32_t indent_01;
  string local_380;
  string local_360;
  allocator local_339;
  undefined1 local_338 [32];
  string local_318;
  allocator local_2f1;
  undefined1 local_2f0 [32];
  string local_2d0;
  allocator local_2a9;
  undefined1 local_2a8 [32];
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  BlendShape *prim_local;
  
  indent_01 = CONCAT31(in_register_00000081,closing_brace);
  local_1c = (uint)prim;
  local_1d = (byte)indent & 1;
  psVar4 = __return_storage_ptr__;
  ptStack_18 = this;
  prim_local = (BlendShape *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar4;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0x20),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," BlendShape \"");
  poVar2 = ::std::operator<<(poVar2,(string *)ptStack_18);
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)((string *)ptStack_18 + 0x7c0));
  n_02 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,(tinyusdz *)((string *)ptStack_18 + 0x7c0),
               (PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    n_02 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,n_02);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2a8,"offsets",&local_2a9);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_2a8 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
              *)local_2a8,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2a8 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x280);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_2f0,"normalOffsets",&local_2f1);
  print_typed_attr<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ((string *)(local_2f0 + 0x20),ptVar3,
             (TypedAttribute<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>
              *)local_2f0,(string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_2f0 + 0x20));
  ::std::__cxx11::string::~string((string *)local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  ptVar3 = (tinyusdz *)((string *)ptStack_18 + 0x4d0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_338,"pointIndices",&local_339);
  print_typed_attr<std::vector<int,std::allocator<int>>>
            ((string *)(local_338 + 0x20),ptVar3,
             (TypedAttribute<std::vector<int,_std::allocator<int>_>_> *)local_338,
             (string *)(ulong)(local_1c + 1),indent_01);
  ::std::operator<<(aoStack_198,(string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)(local_338 + 0x20));
  ::std::__cxx11::string::~string((string *)local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  print_props(&local_360,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)((string *)ptStack_18 + 0x790),local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_360);
  ::std::__cxx11::string::~string((string *)&local_360);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_380,(pprint *)(ulong)local_1c,n_03);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_380);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_380);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const BlendShape &prim, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(prim.spec) << " BlendShape \""
     << prim.name << "\"\n";
  if (prim.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(prim.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  ss << print_typed_attr(prim.offsets, "offsets", indent + 1);
  ss << print_typed_attr(prim.normalOffsets, "normalOffsets", indent + 1);
  ss << print_typed_attr(prim.pointIndices, "pointIndices", indent + 1);

  ss << print_props(prim.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}